

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_publish2channel(channel_s *ch,fio_msg_internal_s *msg)

{
  fio_defer_task_s task;
  subscription_s *s;
  fio_ls_embd_s *pos;
  fio_msg_internal_s *msg_local;
  channel_s *ch_local;
  
  for (s = (subscription_s *)(ch->subscriptions).next; s != (subscription_s *)&ch->subscriptions;
      s = (subscription_s *)(s->node).next) {
    if ((s != (subscription_s *)0x0) && (s->on_message != fio_mock_on_message)) {
      LOCK();
      s->ref = s->ref + 1;
      UNLOCK();
      LOCK();
      msg->ref = msg->ref + 1;
      UNLOCK();
      task.arg1 = s;
      task.func = fio_perform_subscription_callback;
      task.arg2 = msg;
      fio_defer_push_task_fn(task,&task_queue_normal);
      fio_defer_thread_signal();
    }
  }
  fio_msg_internal_free(msg);
  return;
}

Assistant:

static void fio_publish2channel(channel_s *ch, fio_msg_internal_s *msg) {
  FIO_LS_EMBD_FOR(&ch->subscriptions, pos) {
    subscription_s *s = FIO_LS_EMBD_OBJ(subscription_s, node, pos);
    if (!s || s->on_message == fio_mock_on_message) {
      continue;
    }
    fio_atomic_add(&s->ref, 1);
    fio_atomic_add(&msg->ref, 1);
    fio_defer_push_task(fio_perform_subscription_callback, s, msg);
  }
  fio_msg_internal_free(msg);
}